

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::ComputeCommand::submitAndWait
          (ComputeCommand *this,deUint32 queueFamilyIndex,VkQueue queue,
          VkDescriptorUpdateTemplateKHR updateTemplate,void *rawUpdateData)

{
  VkResult VVar1;
  VkStructureType local_158 [2];
  undefined4 uStack_150;
  undefined4 uStack_14c;
  deUint32 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  VkFence local_138;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_130;
  VkCommandPool local_118;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_110;
  VkCommandBufferAllocateInfo cmdBufCreateInfo;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  VkFenceCreateInfo fenceCreateInfo;
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  
  cmdPoolCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolCreateInfo.pNext = (void *)0x0;
  cmdPoolCreateInfo.flags = 1;
  cmdPoolCreateInfo.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,this->m_vki,this->m_device,
             &cmdPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  DStack_110.m_device = (VkDevice)submitInfo._16_8_;
  DStack_110.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_118.m_internal = submitInfo._0_8_;
  DStack_110.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  fenceCreateInfo.flags = 0;
  fenceCreateInfo._20_4_ = 0;
  fenceCreateInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  fenceCreateInfo._4_4_ = 0;
  fenceCreateInfo.pNext = (void *)0x0;
  cmdBufCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufCreateInfo.pNext = (void *)0x0;
  cmdBufCreateInfo.commandPool.m_internal = submitInfo._0_8_;
  cmdBufCreateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufCreateInfo.commandBufferCount = 1;
  cmdBufBeginInfo.flags = 1;
  cmdBufBeginInfo._20_4_ = 0;
  cmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufBeginInfo._4_4_ = 0;
  cmdBufBeginInfo.pNext = (void *)0x0;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,this->m_vki,this->m_device,
                    &fenceCreateInfo,(VkAllocationCallbacks *)0x0);
  DStack_130.m_device = (VkDevice)submitInfo._16_8_;
  DStack_130.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_138.m_internal = submitInfo._0_8_;
  DStack_130.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,this->m_vki,this->m_device,
             &cmdBufCreateInfo);
  local_148 = submitInfo.waitSemaphoreCount;
  uStack_144 = submitInfo._20_4_;
  uStack_140 = submitInfo.pWaitSemaphores._0_4_;
  uStack_13c = submitInfo.pWaitSemaphores._4_4_;
  local_158[0] = submitInfo.sType;
  local_158[1] = submitInfo._4_4_;
  uStack_150 = submitInfo.pNext._0_4_;
  uStack_14c = submitInfo.pNext._4_4_;
  VVar1 = (*this->m_vki->_vptr_DeviceInterface[0x49])(this->m_vki,submitInfo._0_8_,&cmdBufBeginInfo)
  ;
  ::vk::checkResult(VVar1,"m_vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x831);
  (*this->m_vki->_vptr_DeviceInterface[0x4c])
            (this->m_vki,CONCAT44(local_158[1],local_158[0]),1,(this->m_pipeline).m_internal);
  if (this->m_numDescriptorSets != 0) {
    (*this->m_vki->_vptr_DeviceInterface[0x56])
              (this->m_vki,CONCAT44(local_158[1],local_158[0]),1,(this->m_pipelineLayout).m_internal
               ,0,(ulong)(uint)this->m_numDescriptorSets,this->m_descriptorSets,
               (ulong)(uint)this->m_numDynamicOffsets,this->m_dynamicOffsets);
  }
  if (updateTemplate.m_internal != 0) {
    (*this->m_vki->_vptr_DeviceInterface[0x93])
              (this->m_vki,CONCAT44(local_158[1],local_158[0]),updateTemplate.m_internal,
               (this->m_pipelineLayout).m_internal,0,rawUpdateData);
  }
  if (this->m_numPreBarriers != 0) {
    (*this->m_vki->_vptr_DeviceInterface[0x6d])
              (this->m_vki,CONCAT44(local_158[1],local_158[0]),1,0x800,0,0,0,
               (ulong)(uint)this->m_numPreBarriers,this->m_preBarriers,0,0);
  }
  (*this->m_vki->_vptr_DeviceInterface[0x5d])
            (this->m_vki,CONCAT44(local_158[1],local_158[0]),
             (ulong)(this->m_numWorkGroups).m_data[0],(ulong)(this->m_numWorkGroups).m_data[1],
             (ulong)(this->m_numWorkGroups).m_data[2]);
  (*this->m_vki->_vptr_DeviceInterface[0x6d])
            (this->m_vki,CONCAT44(local_158[1],local_158[0]),0x800,1,0,0,0,
             (ulong)(uint)this->m_numPostBarriers,this->m_postBarriers,0,0);
  VVar1 = (*this->m_vki->_vptr_DeviceInterface[0x4a])
                    (this->m_vki,CONCAT44(local_158[1],local_158[0]));
  ::vk::checkResult(VVar1,"m_vki.endCommandBuffer(*cmd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x84b);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)local_158;
  VVar1 = (*this->m_vki->_vptr_DeviceInterface[2])
                    (this->m_vki,queue,1,&submitInfo,local_138.m_internal);
  ::vk::checkResult(VVar1,"m_vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x85b);
  VVar1 = (*this->m_vki->_vptr_DeviceInterface[0x16])
                    (this->m_vki,this->m_device,1,&local_138,0,0xffffffffffffffff);
  ::vk::checkResult(VVar1,
                    "m_vki.waitForFences(m_device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x85d);
  if (CONCAT44(local_158[1],local_158[0]) != 0) {
    submitInfo._0_8_ = CONCAT44(local_158[1],local_158[0]);
    (**(code **)(*(long *)CONCAT44(uStack_14c,uStack_150) + 0x240))
              ((long *)CONCAT44(uStack_14c,uStack_150),CONCAT44(uStack_144,local_148),
               CONCAT44(uStack_13c,uStack_140),1);
  }
  if (local_138.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_130,local_138);
  }
  if (local_118.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_110,local_118);
  }
  return;
}

Assistant:

void ComputeCommand::submitAndWait (deUint32 queueFamilyIndex, vk::VkQueue queue, vk::VkDescriptorUpdateTemplateKHR updateTemplate, const void *rawUpdateData) const
{
	const vk::VkCommandPoolCreateInfo				cmdPoolCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
		DE_NULL,
		vk::VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// flags
		queueFamilyIndex,									// queueFamilyIndex
	};
	const vk::Unique<vk::VkCommandPool>				cmdPool				(vk::createCommandPool(m_vki, m_device, &cmdPoolCreateInfo));

	const vk::VkFenceCreateInfo						fenceCreateInfo		=
	{
		vk::VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,
		DE_NULL,
		0u,			// flags
	};

	const vk::VkCommandBufferAllocateInfo			cmdBufCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
		DE_NULL,
		*cmdPool,											// cmdPool
		vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY,				// level
		1u,													// count
	};
	const vk::VkCommandBufferBeginInfo				cmdBufBeginInfo		=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// flags
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const vk::Unique<vk::VkFence>					cmdCompleteFence	(vk::createFence(m_vki, m_device, &fenceCreateInfo));
	const vk::Unique<vk::VkCommandBuffer>			cmd					(vk::allocateCommandBuffer(m_vki, m_device, &cmdBufCreateInfo));
	const deUint64									infiniteTimeout		= ~(deUint64)0u;

	VK_CHECK(m_vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo));

	m_vki.cmdBindPipeline(*cmd, vk::VK_PIPELINE_BIND_POINT_COMPUTE, m_pipeline);

	if (m_numDescriptorSets)
	{
		m_vki.cmdBindDescriptorSets(*cmd, vk::VK_PIPELINE_BIND_POINT_COMPUTE, m_pipelineLayout, 0, m_numDescriptorSets, m_descriptorSets, m_numDynamicOffsets, m_dynamicOffsets);
	}

	if (updateTemplate != DE_NULL)
	{
		// we need to update the push descriptors
		m_vki.cmdPushDescriptorSetWithTemplateKHR(*cmd, updateTemplate, m_pipelineLayout, 0, rawUpdateData);
	}

	if (m_numPreBarriers)
		m_vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (vk::VkDependencyFlags)0,
								 0, (const vk::VkMemoryBarrier*)DE_NULL,
								 m_numPreBarriers, m_preBarriers,
								 0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	m_vki.cmdDispatch(*cmd, m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());
	m_vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
							 0, (const vk::VkMemoryBarrier*)DE_NULL,
							 m_numPostBarriers, m_postBarriers,
							 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	VK_CHECK(m_vki.endCommandBuffer(*cmd));

	// run
	{
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			0u,
			(const vk::VkSemaphore*)0,
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,
			&cmd.get(),
			0u,
			(const vk::VkSemaphore*)0,
		};
		VK_CHECK(m_vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence));
	}
	VK_CHECK(m_vki.waitForFences(m_device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure
}